

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

uint xkb_mask_modifier(XkbDescPtr xkb,char *name)

{
  uint in_EAX;
  int iVar1;
  uint uVar2;
  char *__s2;
  wchar_t i;
  ulong uVar3;
  uint uVar4;
  ulong uStack_38;
  uint mask;
  
  uStack_38 = (ulong)in_EAX;
  iVar1 = strcmp(name,"Caps Lock");
  if (iVar1 == 0) {
    uVar4 = 2;
  }
  else {
    uVar4 = 0;
    uVar2 = 0;
    for (uVar3 = 0; (uVar2 == 0 && (uVar3 < 0x10)); uVar3 = uVar3 + 1) {
      if (xkb->names->vmods[uVar3] != 0) {
        __s2 = (char *)XGetAtomName(xkb->dpy);
        if (__s2 != (char *)0x0) {
          iVar1 = strcmp(name,__s2);
          if (iVar1 == 0) {
            XkbVirtualModsToReal(xkb,1 << ((byte)uVar3 & 0x1f),&mask);
          }
          XFree(__s2);
        }
      }
      uVar2 = mask;
    }
  }
  return uVar4;
}

Assistant:

static unsigned int xkb_mask_modifier( XkbDescPtr xkb, const char *name )
{
	unsigned int mask=0;
	
	if (streq(name, "Caps Lock")) return 2;
	
	for (int i = 0; (!mask) && (i < XkbNumVirtualMods); i++ ) {
		char* modStr;

		/* Avoid BadAtom errors:  skip elements with a null atom. */
		if (xkb->names->vmods[i] == None) {
		        continue;
		}
		modStr = XGetAtomName( xkb->dpy, xkb->names->vmods[i] );
		if (modStr) {
			if (streq(name, modStr))
				XkbVirtualModsToReal( xkb, 1U << i, &mask );

			XFree(modStr);
		}
	}
	return 0;
}